

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::SetGlobalGenerator
          (cmake *this,unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *gg)

{
  bool bVar1;
  ulong uVar2;
  pointer this_00;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string env;
  allocator<char> local_39;
  string local_38;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *local_18;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *gg_local;
  cmake *this_local;
  
  local_18 = gg;
  gg_local = (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)gg);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"CC=",&local_71);
      std::allocator<char>::~allocator(&local_71);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_70,(string *)&this->CCEnvironment);
        cmsys::SystemTools::PutEnv((string *)local_70);
      }
      else {
        cmsys::SystemTools::UnPutEnv((string *)local_70);
      }
      std::__cxx11::string::operator=((string *)local_70,"CXX=");
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_70,(string *)&this->CXXEnvironment);
        cmsys::SystemTools::PutEnv((string *)local_70);
      }
      else {
        cmsys::SystemTools::UnPutEnv((string *)local_70);
      }
      std::__cxx11::string::~string((string *)local_70);
    }
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator=
              (&this->GlobalGenerator,gg);
    this_00 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
              operator->(&this->GlobalGenerator);
    bVar1 = cmGlobalGenerator::GetForceUnixPaths(this_00);
    cmSystemTools::SetForceUnixPaths(bVar1);
    bVar1 = cmsys::SystemTools::GetEnv("CXX",&this->CXXEnvironment);
    if (!bVar1) {
      std::__cxx11::string::clear();
    }
    bVar1 = cmsys::SystemTools::GetEnv("CC",&this->CCEnvironment);
    if (!bVar1) {
      std::__cxx11::string::clear();
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Error SetGlobalGenerator called with null",&local_39);
    cmSystemTools::Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void cmake::SetGlobalGenerator(std::unique_ptr<cmGlobalGenerator> gg)
{
  if (!gg) {
    cmSystemTools::Error("Error SetGlobalGenerator called with null");
    return;
  }
  if (this->GlobalGenerator) {
    // restore the original environment variables CXX and CC
    std::string env = "CC=";
    if (!this->CCEnvironment.empty()) {
      env += this->CCEnvironment;
      cmSystemTools::PutEnv(env);
    } else {
      cmSystemTools::UnPutEnv(env);
    }
    env = "CXX=";
    if (!this->CXXEnvironment.empty()) {
      env += this->CXXEnvironment;
      cmSystemTools::PutEnv(env);
    } else {
      cmSystemTools::UnPutEnv(env);
    }
  }

  // set the new
  this->GlobalGenerator = std::move(gg);

  // set the global flag for unix style paths on cmSystemTools as soon as
  // the generator is set.  This allows gmake to be used on windows.
  cmSystemTools::SetForceUnixPaths(this->GlobalGenerator->GetForceUnixPaths());

  // Save the environment variables CXX and CC
  if (!cmSystemTools::GetEnv("CXX", this->CXXEnvironment)) {
    this->CXXEnvironment.clear();
  }
  if (!cmSystemTools::GetEnv("CC", this->CCEnvironment)) {
    this->CCEnvironment.clear();
  }
}